

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O1

void ncnn::binary_op_broadcast<ncnn::binary_op_pow>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  void *pvVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  float *pfVar31;
  long lVar32;
  long lVar33;
  float *pfVar34;
  void *pvVar35;
  ulong uVar36;
  ulong uVar37;
  void *pvVar38;
  float fVar39;
  ulong local_d8;
  
  iVar1 = c->dims;
  uVar2 = c->w;
  uVar3 = c->h;
  iVar4 = c->d;
  uVar5 = c->c;
  if (iVar1 == 2) {
    if (0 < (int)uVar3) {
      pvVar11 = a->data;
      iVar6 = a->w;
      pvVar14 = b->data;
      iVar7 = b->w;
      pvVar35 = c->data;
      uVar29 = 1;
      if (1 < (int)uVar3) {
        uVar29 = (ulong)uVar3;
      }
      sVar12 = c->elemsize;
      sVar13 = a->elemsize;
      uVar28 = (ulong)(a->h + -1);
      sVar15 = b->elemsize;
      uVar19 = (ulong)(b->h + -1);
      uVar25 = 0;
      do {
        uVar37 = uVar28;
        if ((long)uVar25 < (long)uVar28) {
          uVar37 = uVar25;
        }
        uVar36 = uVar19;
        if ((long)uVar25 < (long)uVar19) {
          uVar36 = uVar25;
        }
        if (0 < (int)uVar2) {
          pfVar31 = (float *)(uVar37 * (long)iVar6 * sVar13 + (long)pvVar11);
          pfVar34 = (float *)(uVar36 * (long)iVar7 * sVar15 + (long)pvVar14);
          uVar37 = 0;
          do {
            fVar39 = powf(*pfVar31,*pfVar34);
            *(float *)((long)pvVar35 + uVar37 * 4) = fVar39;
            uVar37 = uVar37 + 1;
            pfVar31 = pfVar31 + (1 < (long)iVar6);
            pfVar34 = pfVar34 + (1 < (long)iVar7);
          } while (uVar2 != uVar37);
        }
        uVar25 = uVar25 + 1;
        pvVar35 = (void *)((long)pvVar35 + sVar12 * (long)(int)uVar2);
      } while (uVar25 != uVar29);
    }
  }
  else if ((iVar1 == 1) && (0 < (int)uVar2)) {
    pvVar11 = c->data;
    iVar6 = b->w;
    iVar7 = a->w;
    pfVar31 = (float *)b->data;
    pfVar34 = (float *)a->data;
    uVar29 = 0;
    do {
      fVar39 = powf(*pfVar34,*pfVar31);
      *(float *)((long)pvVar11 + uVar29 * 4) = fVar39;
      uVar29 = uVar29 + 1;
      pfVar34 = pfVar34 + (1 < iVar7);
      pfVar31 = pfVar31 + (1 < iVar6);
    } while (uVar2 != uVar29);
  }
  if (0 < (int)uVar5 && iVar1 - 3U < 2) {
    pvVar11 = c->data;
    sVar12 = c->cstep;
    sVar13 = c->elemsize;
    iVar1 = a->w;
    iVar6 = b->w;
    local_d8 = 0;
    do {
      if (0 < iVar4) {
        pvVar38 = (void *)(sVar12 * sVar13 * local_d8 + (long)pvVar11);
        iVar7 = a->w;
        iVar8 = a->h;
        pvVar14 = a->data;
        sVar15 = a->elemsize;
        iVar9 = b->w;
        iVar10 = b->h;
        pvVar35 = b->data;
        sVar16 = b->elemsize;
        uVar29 = (ulong)(b->c + -1);
        if ((long)local_d8 < (long)uVar29) {
          uVar29 = local_d8;
        }
        sVar17 = b->cstep;
        lVar32 = (long)(b->d + -1);
        uVar19 = (ulong)(a->c + -1);
        if ((long)local_d8 < (long)uVar19) {
          uVar19 = local_d8;
        }
        sVar18 = a->cstep;
        lVar20 = (long)(iVar10 + -1);
        lVar21 = (long)(a->d + -1);
        lVar22 = (long)(iVar8 + -1);
        lVar26 = 0;
        do {
          lVar27 = lVar32;
          if (lVar26 < lVar32) {
            lVar27 = lVar26;
          }
          lVar23 = lVar21;
          if (lVar26 < lVar21) {
            lVar23 = lVar26;
          }
          if (0 < (int)uVar3) {
            lVar24 = 0;
            do {
              lVar30 = lVar20;
              if (lVar24 < lVar20) {
                lVar30 = lVar24;
              }
              lVar33 = lVar22;
              if (lVar24 < lVar22) {
                lVar33 = lVar24;
              }
              if (0 < (int)uVar2) {
                pfVar31 = (float *)(((lVar30 + lVar27 * iVar10) * (long)iVar9 + uVar29 * sVar17) *
                                    sVar16 + (long)pvVar35);
                pfVar34 = (float *)(((lVar33 + lVar23 * iVar8) * (long)iVar7 + uVar19 * sVar18) *
                                    sVar15 + (long)pvVar14);
                uVar28 = 0;
                do {
                  fVar39 = powf(*pfVar34,*pfVar31);
                  *(float *)((long)pvVar38 + uVar28 * 4) = fVar39;
                  uVar28 = uVar28 + 1;
                  pfVar31 = pfVar31 + (1 < iVar6);
                  pfVar34 = pfVar34 + (1 < iVar1);
                } while (uVar2 != uVar28);
              }
              pvVar38 = (void *)((long)pvVar38 + (long)(int)uVar2 * 4);
              lVar24 = lVar24 + 1;
            } while ((uint)lVar24 != uVar3);
          }
          lVar26 = lVar26 + 1;
        } while ((int)lVar26 != iVar4);
      }
      local_d8 = local_d8 + 1;
    } while (local_d8 != uVar5);
  }
  return;
}

Assistant:

static void binary_op_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    // general broadcast
    const Op op;

    const int dims = c.dims;
    const int w = c.w;
    const int h = c.h;
    const int d = c.d;
    const int channels = c.c;

    if (dims == 1)
    {
        const float* ptr = a;
        const float* ptr1 = b;
        float* outptr = c;

        const int ainc = a.w > 1 ? 1 : 0;
        const int binc = b.w > 1 ? 1 : 0;

        for (int x = 0; x < w; x++)
        {
            outptr[x] = op(*ptr, *ptr1);
            ptr += ainc;
            ptr1 += binc;
        }
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const float* ptr = a.row(std::min(y, a.h - 1));
            const float* ptr1 = b.row(std::min(y, b.h - 1));
            float* outptr = c.row(y);

            const int ainc = a.w > 1 ? 1 : 0;
            const int binc = b.w > 1 ? 1 : 0;

            for (int x = 0; x < w; x++)
            {
                outptr[x] = op(*ptr, *ptr1);
                ptr += ainc;
                ptr1 += binc;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = c.channel(q);

            const int ainc = a.w > 1 ? 1 : 0;
            const int binc = b.w > 1 ? 1 : 0;

            for (int z = 0; z < d; z++)
            {
                for (int y = 0; y < h; y++)
                {
                    const float* ptr = a.channel(std::min(q, a.c - 1)).depth(std::min(z, a.d - 1)).row(std::min(y, a.h - 1));
                    const float* ptr1 = b.channel(std::min(q, b.c - 1)).depth(std::min(z, b.d - 1)).row(std::min(y, b.h - 1));

                    for (int x = 0; x < w; x++)
                    {
                        outptr[x] = op(*ptr, *ptr1);
                        ptr += ainc;
                        ptr1 += binc;
                    }

                    outptr += w;
                }
            }
        }
    }
}